

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

void __thiscall tonk::gateway::SSDPRequester::OnTick(SSDPRequester *this)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  uint64_t uVar1;
  Result result;
  undefined1 local_1c0 [8];
  string local_1b8;
  LogStringBuffer local_198;
  
  if (this->NeedsInitialization == true) {
    this->NeedsInitialization = false;
    InitializeSockets((SSDPRequester *)local_1c0);
    if (local_1c0 != (undefined1  [8])0x0) {
      Result::ToJson_abi_cxx11_((string *)(local_1c0 + 8),(Result *)local_1c0);
      if (DAT_001d8d30 < 5) {
        this_00 = &local_198.LogStream;
        local_198.ChannelName = ModuleLogger;
        local_198.LogLevel = 4;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::operator<<((ostream *)this_00,(string *)&DAT_001d8d60);
        std::operator<<((ostream *)this_00,"Socket initialization failed: ");
        std::operator<<((ostream *)this_00,(string *)(local_1c0 + 8));
        this_01 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_01,&local_198);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
      }
      std::__cxx11::string::~string((string *)(local_1c0 + 8));
      Result::~Result((Result *)local_1c0);
      return;
    }
    Result::~Result((Result *)local_1c0);
  }
  uVar1 = siamese::GetTimeUsec();
  if (5000000 < uVar1 - this->LastLANInfoRequestUsec) {
    uVar1 = siamese::GetTimeUsec();
    this->LastLANInfoRequestUsec = uVar1;
    PollLANInfo(this);
  }
  if (0 < this->AttemptsRemaining) {
    this->AttemptsRemaining = this->AttemptsRemaining + -1;
    RequestSSDP(this);
  }
  return;
}

Assistant:

void SSDPRequester::OnTick()
{
    // If initialization is needed:
    if (NeedsInitialization)
    {
        NeedsInitialization = false;

        // Attempt to initialize sockets
        Result result = InitializeSockets();

        // If attempt failed:
        if (result.IsFail())
        {
            ModuleLogger.Error("Socket initialization failed: ", result.ToJson());
            return;
        }
    }

    // If poll timer has expired:
    const uint64_t nowUsec = siamese::GetTimeUsec();
    if (nowUsec - LastLANInfoRequestUsec > protocol::kLANInfoIntervalUsec)
    {
        LastLANInfoRequestUsec = siamese::GetTimeUsec();

        // Check if LAN info changed
        PollLANInfo();
    }

    // If there are no multicasts requested:
    if (AttemptsRemaining <= 0) {
        return;
    }

    AttemptsRemaining--;

    // Request SSDP from gateway
    RequestSSDP();
}